

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O3

void de::cmdline::detail::TypedFieldValueTraits<std::vector<int,_std::allocator<int>_>_>::destroy
               (void *value)

{
  void *pvVar1;
  
  if ((value != (void *)0x0) && (pvVar1 = *value, pvVar1 != (void *)0x0)) {
    operator_delete(pvVar1,*(long *)((long)value + 0x10) - (long)pvVar1);
  }
  operator_delete(value,0x18);
  return;
}

Assistant:

static void destroy (void* value) { delete (Value*)value; }